

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::FillPackageRootPath(cmFindBase *this)

{
  bool bVar1;
  reference __lhs;
  undefined1 local_78 [8];
  string varName;
  undefined1 local_38 [8];
  reverse_iterator pkg;
  cmSearchPath *paths;
  cmFindBase *this_local;
  
  pkg.current._M_node =
       (_Map_pointer)
       std::
       map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
       ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::PackageRoot);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::rbegin((reverse_iterator *)local_38,
           &((this->super_cmFindCommon).super_cmCommand.Makefile)->FindPackageModuleStack);
  while( true ) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rend((reverse_iterator *)((long)&varName.field_2 + 8),
           &((this->super_cmFindCommon).super_cmCommand.Makefile)->FindPackageModuleStack);
    bVar1 = std::operator!=((reverse_iterator<std::_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                             *)local_38,
                            (reverse_iterator<std::_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                             *)((long)&varName.field_2 + 8));
    if (!bVar1) break;
    __lhs = std::
            reverse_iterator<std::_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::operator*((reverse_iterator<std::_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                         *)local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   __lhs,"_ROOT");
    cmSearchPath::AddCMakePrefixPath
              ((cmSearchPath *)pkg.current._M_node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    cmSearchPath::AddEnvPrefixPath((cmSearchPath *)pkg.current._M_node,(string *)local_78,false);
    std::__cxx11::string::~string((string *)local_78);
    std::
    reverse_iterator<std::_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::operator++((reverse_iterator<std::_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                  *)local_38);
  }
  cmSearchPath::AddSuffixes
            ((cmSearchPath *)pkg.current._M_node,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillPackageRootPath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRoot];

  // Add package specific search prefixes
  // NOTE: This should be using const_reverse_iterator but HP aCC and
  //       Oracle sunCC both currently have standard library issues
  //       with the reverse iterator APIs.
  for (std::deque<std::string>::reverse_iterator pkg =
         this->Makefile->FindPackageModuleStack.rbegin();
       pkg != this->Makefile->FindPackageModuleStack.rend(); ++pkg) {
    std::string varName = *pkg + "_ROOT";
    paths.AddCMakePrefixPath(varName);
    paths.AddEnvPrefixPath(varName);
  }

  paths.AddSuffixes(this->SearchPathSuffixes);
}